

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Vec3 __thiscall
vkt::sr::anon_unknown_0::MatrixCaseUtils::reduceToVec3(MatrixCaseUtils *this,Mat2x4 *value)

{
  Vector<float,_4> *pVVar1;
  Vector<float,_3> VVar2;
  Vec3 VVar3;
  undefined1 local_30 [12];
  undefined1 local_24 [20];
  Mat2x4 *value_local;
  float fVar4;
  
  local_24._12_8_ = value;
  value_local = (Mat2x4 *)this;
  pVVar1 = tcu::Matrix<float,_4,_2>::getColumn(value,0);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_24,(int)pVVar1,0,1);
  pVVar1 = tcu::Matrix<float,_4,_2>::getColumn((Matrix<float,_4,_2> *)local_24._12_8_,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)pVVar1,1,2);
  VVar2 = tcu::operator+((tcu *)this,(Vector<float,_3> *)local_24,(Vector<float,_3> *)local_30);
  VVar3.m_data[0] = VVar2.m_data[0];
  VVar3.m_data[1] = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  return (Vec3)VVar3.m_data;
}

Assistant:

inline tcu::Vec3 reduceToVec3 (const tcu::Mat2x4& value)	{ return value.getColumn(0).swizzle(0,1,2) + value.getColumn(1).swizzle(1,2,3); }